

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageStore.cpp
# Opt level: O2

void __thiscall
FIX::MessageStoreExceptionWrapper::refresh
          (MessageStoreExceptionWrapper *this,bool *threw,IOException *ex)

{
  *threw = false;
  (**(code **)(**(long **)this + 0x60))();
  return;
}

Assistant:

void MessageStoreExceptionWrapper::refresh(bool &threw, IOException &ex) {
  threw = false;
  try {
    m_pStore->refresh();
  } catch (IOException &e) {
    threw = true;
    ex = e;
  }
}